

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O0

void __thiscall Func::OnAddSym(Func *this,Sym *sym)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Sym *sym_local;
  Func *this_local;
  
  if (sym == (Sym *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                       ,0x32d,"(sym)","sym");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = IsJitInDebugMode(this);
  if ((bVar2) && (bVar2 = IsNonTempLocalVar(this,sym->m_id), bVar2)) {
    if (this->m_nonTempLocalVars == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                         ,0x330,"(m_nonTempLocalVars)","m_nonTempLocalVars");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    BVSparse<Memory::JitArenaAllocator>::Set(this->m_nonTempLocalVars,sym->m_id);
  }
  return;
}

Assistant:

void Func::OnAddSym(Sym* sym)
{
    Assert(sym);
    if (this->IsJitInDebugMode() && this->IsNonTempLocalVar(sym->m_id))
    {
        Assert(m_nonTempLocalVars);
        m_nonTempLocalVars->Set(sym->m_id);
    }
}